

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element>
          (QPodArrayOps<QtCbor::Element> *this,qsizetype i,Element *args)

{
  Element **ppEVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  anon_union_8_2_4ee71171_for_Element_0 aVar4;
  Type TVar5;
  ValueFlags VVar6;
  qsizetype qVar7;
  Element *pEVar8;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QtCbor::Element>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QtCbor::Element>).size == i) &&
       (qVar7 = QArrayDataPointer<QtCbor::Element>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QtCbor::Element>), qVar7 != 0)) {
      TVar5 = args->type;
      VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (args->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
      pEVar8 = (this->super_QArrayDataPointer<QtCbor::Element>).ptr +
               (this->super_QArrayDataPointer<QtCbor::Element>).size;
      pEVar8->field_0 = args->field_0;
      pEVar8->type = TVar5;
      pEVar8->flags =
           (ValueFlags)
           VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    }
    else {
      if ((i != 0) ||
         (qVar7 = QArrayDataPointer<QtCbor::Element>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<QtCbor::Element>), qVar7 == 0))
      goto LAB_00140c40;
      pEVar8 = (this->super_QArrayDataPointer<QtCbor::Element>).ptr;
      TVar5 = args->type;
      VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (args->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
      pEVar8[-1].field_0 = args->field_0;
      pEVar8[-1].type = TVar5;
      pEVar8[-1].flags =
           (ValueFlags)
           VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
      ppEVar1 = &(this->super_QArrayDataPointer<QtCbor::Element>).ptr;
      *ppEVar1 = *ppEVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QtCbor::Element>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_00140c40:
  aVar4 = args->field_0;
  TVar5 = args->type;
  VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
  super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
       (args->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QtCbor::Element>).size != 0);
  QArrayDataPointer<QtCbor::Element>::detachAndGrow
            (&this->super_QArrayDataPointer<QtCbor::Element>,where,1,(Element **)0x0,
             (QArrayDataPointer<QtCbor::Element> *)0x0);
  pEVar8 = createHole(this,where,i,1);
  pEVar8->field_0 = aVar4;
  pEVar8->type = TVar5;
  pEVar8->flags =
       (ValueFlags)
       VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
       super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }